

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O3

uc_err uc_hook_del(uc_engine *uc,uc_hook hh)

{
  _Bool _Var1;
  uc_err uVar2;
  void *pvVar3;
  long lVar4;
  int *piVar5;
  
  if ((uc->init_done != false) || (uVar2 = uc_init_engine(uc), uVar2 == UC_ERR_OK)) {
    piVar5 = uc->hooks_count;
    lVar4 = 0x328;
    do {
      _Var1 = list_exists((list *)((long)&uc->arch + lVar4),(void *)hh);
      if (_Var1) {
        g_hash_table_foreach(*(GHashTable **)(hh + 0x38),hook_invalidate_region,uc);
        g_hash_table_remove_all(*(GHashTable **)(hh + 0x38));
        *(undefined1 *)(hh + 0x14) = 1;
        *piVar5 = *piVar5 + -1;
        pvVar3 = list_append(&uc->hooks_to_del,(void *)hh);
        if (pvVar3 != (void *)0x0) {
          *(int *)(hh + 8) = *(int *)(hh + 8) + 1;
        }
      }
      piVar5 = piVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x4d8);
    uVar2 = UC_ERR_OK;
  }
  return uVar2;
}

Assistant:

UNICORN_EXPORT
uc_err uc_hook_del(uc_engine *uc, uc_hook hh)
{
    int i;
    struct hook *hook = (struct hook *)hh;

    UC_INIT(uc);

    // we can't dereference hook->type if hook is invalid
    // so for now we need to iterate over all possible types to remove the hook
    // which is less efficient
    // an optimization would be to align the hook pointer
    // and store the type mask in the hook pointer.
    for (i = 0; i < UC_HOOK_MAX; i++) {
        if (list_exists(&uc->hook[i], (void *)hook)) {
            g_hash_table_foreach(hook->hooked_regions, hook_invalidate_region,
                                 uc);
            g_hash_table_remove_all(hook->hooked_regions);
            hook->to_delete = true;
            uc->hooks_count[i]--;
            hook_append(&uc->hooks_to_del, hook);
        }
    }

    return UC_ERR_OK;
}